

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int bitstream_r_read(bitstream_r *stream,uint64_t *dst,int32_t bits)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  
  uVar2 = 0;
  if (0 < bits) {
    if (0x38 < (uint)bits) {
      return -1;
    }
    uVar1 = stream->bit_offset;
    uVar6 = uVar1 + (uint)bits + 7 >> 3;
    if (stream->length < uVar6) {
      return -1;
    }
    uVar4 = (uint)bits + uVar1;
    stream->bit_offset = uVar4;
    pbVar5 = (byte *)((long)stream->ptr + (uVar1 >> 3));
    uVar2 = (ulong)(0xffU >> ((byte)uVar1 & 7) & (uint)*pbVar5);
    for (uVar6 = uVar6 - (uVar1 >> 3); pbVar5 = pbVar5 + 1, 1 < uVar6; uVar6 = uVar6 - 1) {
      uVar2 = uVar2 << 8 | (ulong)*pbVar5;
    }
    bVar3 = 8 - ((byte)uVar4 & 7);
    if ((uVar4 & 7) == 0) {
      bVar3 = 0;
    }
    uVar2 = uVar2 >> (bVar3 & 0x3f);
  }
  *dst = uVar2;
  return 0;
}

Assistant:

int
bitstream_r_read(struct bitstream_r *stream, uint64_t *dst, int32_t bits) {
  size_t offset, size, bit_start, bit_end;
  const uint8_t *buffer;
  uint64_t result;

  if (bits <= 0) {
    *dst = 0;
    return 0;
  }

  if (bits > 56) {
    return -1;
  }

  buffer = stream->ptr;

  /* copy range */
  bit_start = stream->bit_offset;
  bit_end = bit_start + bits;

  /* calculate offset */
  offset = bit_start / 8;
  size = (bit_end + 7) / 8 - offset;

  /* check range */
  if (offset + size > stream->length) {
    return -1;
  }

  /* advance pointer */
  stream->bit_offset += bits;

  /* truncate bit positions */
  bit_start = bit_start & 7;
  bit_end = bit_end & 7;

  /* copy first byte */
  result = buffer[offset];
  if (bit_start != 0) {
    result &= (0xFF >> bit_start);
  }

  while (size > 1) {
    offset++;
    size--;

    result = (result << 8) | buffer[offset];
  }

  if (bit_end != 0) {
    result >>= (8 - bit_end);
  }

  *dst = result;
  return 0;
}